

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::KdTree::get_nearest_neighbors_leaf
          (KdTree *this,index_t node_index,index_t b,index_t e,double *query_point,
          NearestNeighbors *NN)

{
  index_t iVar1;
  index_t iVar2;
  pointer puVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  index_t local_idx [16];
  double local_sq_dist [16];
  index_t local_e8 [16];
  double adStack_a8 [16];
  
  uVar5 = (ulong)(e - b);
  NN->nb_visited = NN->nb_visited + uVar5;
  if (NN->nb_neighbors == NN->nb_neighbors_max) {
    dVar10 = NN->neighbors_sq_dist[NN->nb_neighbors - 1];
  }
  else {
    dVar10 = 1.79769313486232e+308;
  }
  if (e != b) {
    puVar3 = (this->point_index_).
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->super_NearestNeighborSearch).points_;
    iVar1 = (this->super_NearestNeighborSearch).stride_;
    uVar8 = (ulong)(byte)(this->super_NearestNeighborSearch).super_Counted.field_0xc;
    uVar7 = 0;
    do {
      iVar2 = puVar3[b + uVar7];
      if (uVar8 == 0) {
        dVar9 = 0.0;
      }
      else {
        dVar9 = 0.0;
        uVar6 = 0;
        do {
          dVar11 = pdVar4[iVar1 * iVar2 + uVar6] - query_point[uVar6];
          dVar9 = dVar9 + dVar11 * dVar11;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      local_e8[uVar7] = iVar2;
      adStack_a8[uVar7] = dVar9;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  if (e != b) {
    uVar8 = 0;
    do {
      if (adStack_a8[uVar8] <= dVar10) {
        NearestNeighbors::insert(NN,local_e8[uVar8],adStack_a8[uVar8]);
        dVar10 = 1.79769313486232e+308;
        if (NN->nb_neighbors == NN->nb_neighbors_max) {
          dVar10 = NN->neighbors_sq_dist[NN->nb_neighbors - 1];
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void KdTree::get_nearest_neighbors_leaf(
	index_t node_index, index_t b, index_t e,
	const double* query_point,
	NearestNeighbors& NN	    
    ) const {
	geo_argused(node_index);
        NN.nb_visited += (e-b);
	double R = NN.furthest_neighbor_sq_dist();
	index_t nb = e-b;
	const index_t* geo_restrict idx = &point_index_[b];

	// TODO: check generated ASM (I'd like to have AVX here).
	// We may need to dispatch according to dimension.
	
	index_t local_idx[MAX_LEAF_SIZE];
	double  local_sq_dist[MAX_LEAF_SIZE];

	// Cache indices and computed distances in local
	// array. I guess AVX likes that (to be checked).
	// Not sure, because access to p is indirect, maybe
	// I should copy the points to local memory before
	// computing the distances (or having another copy
	// of the points array that I pre-reorder so that
	// leaf's points are in a contiguous chunk of memory),
	// to be tested...
	for(index_t ii=0; ii<nb; ++ii) {
	    index_t i = idx[ii];
	    const double* geo_restrict p = point_ptr(i);
	    double sq_dist = Geom::distance2(
		query_point, p, dimension()
	    );
	    local_idx[ii] = i;
	    local_sq_dist[ii] = sq_dist;
	}

	// Now insert the points that are nearer to query
	// point than NN's bounding ball.
	for(index_t ii=0; ii<nb; ++ii) {
	    double sq_dist = local_sq_dist[ii];
	    if(sq_dist <= R) {
		NN.insert(local_idx[ii],sq_dist);
		R = NN.furthest_neighbor_sq_dist();
	    }
	}
    }